

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

bool LTACMasterdataChannel::PassOnRequest(LTACMasterdataChannel *pChn,acStatUpdateTy *requ)

{
  LTACMasterdataChannel *pLVar1;
  bool bVar2;
  uint uVar3;
  reference ppLVar4;
  undefined8 in_RSI;
  long in_RDI;
  system_error *e;
  LTACMasterdataChannel *ch;
  iterator iter;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  undefined4 in_stack_ffffffffffffff74;
  list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *__val;
  _List_iterator<LTACMasterdataChannel_*> in_stack_ffffffffffffff80;
  _List_iterator<LTACMasterdataChannel_*> in_stack_ffffffffffffff88;
  _Self local_60;
  _Self local_58;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _Self local_38 [4];
  undefined8 local_18;
  long local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff74,
                      CONCAT13(in_stack_ffffffffffffff73,
                               CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70))),
             in_stack_ffffffffffffff68);
  local_38[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::begin
                 ((list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                  in_stack_ffffffffffffff68);
  if (local_10 != 0) {
    __val = &lstChn_abi_cxx11_;
    local_48 = (_List_node_base *)
               std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>
               ::begin((list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                       in_stack_ffffffffffffff68);
    local_50 = (_List_node_base *)
               std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>
               ::end((list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                     in_stack_ffffffffffffff68);
    local_40 = (_List_node_base *)
               std::find<std::_List_iterator<LTACMasterdataChannel*>,LTACMasterdataChannel*>
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          (LTACMasterdataChannel **)__val);
    local_38[0]._M_node = local_40;
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::end
                   ((list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                    in_stack_ffffffffffffff68);
    bVar2 = std::operator!=(local_38,&local_58);
    if (bVar2) {
      std::_List_iterator<LTACMasterdataChannel_*>::operator++(local_38);
    }
  }
  do {
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::end
                   ((list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                    in_stack_ffffffffffffff68);
    bVar2 = std::operator!=(local_38,&local_60);
    if (!bVar2) {
      bVar2 = false;
LAB_001c4d8d:
      std::lock_guard<std::recursive_mutex>::~lock_guard
                ((lock_guard<std::recursive_mutex> *)0x1c4d97);
      if (!bVar2) {
        local_1 = 0;
      }
      return (bool)(local_1 & 1);
    }
    ppLVar4 = std::_List_iterator<LTACMasterdataChannel_*>::operator*
                        ((_List_iterator<LTACMasterdataChannel_*> *)0x1c4d13);
    pLVar1 = *ppLVar4;
    uVar3 = (*(pLVar1->super_LTOnlineChannel).super_LTChannel._vptr_LTChannel[10])();
    if (((uVar3 & 1) != 0) &&
       (uVar3 = (*(pLVar1->super_LTOnlineChannel).super_LTChannel._vptr_LTChannel[0x16])
                          (pLVar1,local_18), (uVar3 & 1) != 0)) {
      local_1 = 1;
      bVar2 = true;
      goto LAB_001c4d8d;
    }
    std::_List_iterator<LTACMasterdataChannel_*>::operator++(local_38);
  } while( true );
}

Assistant:

bool LTACMasterdataChannel::PassOnRequest (LTACMasterdataChannel* pChn, const acStatUpdateTy& requ)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        auto iter = lstChn.begin();
        if (pChn) {                                 // if channel passed in find _next_ channel
            iter = std::find(lstChn.begin(), lstChn.end(), pChn);
            if (iter != lstChn.end()) ++iter;
        }
        // Loop to find a channel, which accepts
        for (;iter != lstChn.end(); ++iter) {
            LTACMasterdataChannel& ch = *(*iter);
            if (ch.IsEnabled() &&
                ch.AcceptRequest(requ))
                return true;
        }

    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
    return false;
}